

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O1

void __thiscall
ElementsConfidentialAddress_EmptyAddressTest_Test::TestBody
          (ElementsConfidentialAddress_EmptyAddressTest_Test *this)

{
  void *pvVar1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest;
  ulong uVar3;
  size_t __n;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  ConfidentialKey key;
  Address unblind_addr;
  ElementsConfidentialAddress empty_address;
  string local_548;
  Pubkey local_520;
  undefined1 local_508 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8 [2];
  pointer local_4d8;
  pointer local_4d0;
  pointer local_388;
  pointer local_378;
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  undefined1 local_350 [384];
  ElementsConfidentialAddress local_1d0;
  
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_1d0);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress((Address *)local_508,&local_1d0);
  local_548._M_dataplus._M_p = (pointer)0x0;
  local_548._M_string_length = 0;
  local_548.field_2._M_allocated_capacity = 0;
  uVar3 = (long)local_4d0 - (long)local_4d8;
  if (uVar3 == 0) {
    __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar3);
  }
  local_548.field_2._M_allocated_capacity = (size_type)(__dest->_M_local_buf + uVar3);
  __n = (long)local_4d0 - (long)local_4d8;
  local_548._M_dataplus._M_p = (pointer)__dest;
  if (__n != 0) {
    local_548._M_string_length = (size_type)__dest;
    memmove(__dest,local_4d8,__n);
  }
  local_548._M_string_length = (long)__dest + __n;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_350,(ByteData *)&local_548);
  pcVar4 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_520,"\"\"",
             "empty_address.GetUnblindedAddress().GetHash().GetHex().c_str()","",
             (char *)local_350._0_8_);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_548._M_dataplus._M_p,
                    local_548.field_2._M_allocated_capacity - (long)local_548._M_dataplus._M_p);
  }
  cfd::core::Address::~Address((Address *)local_508);
  if (local_520.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_508);
    if (local_520.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      pcVar4 = *(char **)local_520.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x25,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_350,(Message *)local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_350);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_508._0_8_ + 8))();
      }
      local_508._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)((long)&local_520.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 8),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            ((ConfidentialKey *)local_350,&local_1d0);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_508,(Pubkey *)local_350);
  pcVar4 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_548,"\"\"","empty_address.GetConfidentialKey().GetHex().c_str()","",
             (char *)local_508._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_508 + 0x10))
  {
    operator_delete((void *)local_508._0_8_,(ulong)(local_4f8[0]._M_allocated_capacity + 1));
  }
  if ((char *)local_350._0_8_ != (char *)0x0) {
    operator_delete((void *)local_350._0_8_,local_350._16_8_ - local_350._0_8_);
  }
  if ((char)local_548._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_508);
    if ((undefined8 *)local_548._M_string_length != (undefined8 *)0x0) {
      pcVar4 = *(char **)local_548._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x26,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_350,(Message *)local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_350);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_508._0_8_ + 8))();
      }
      local_508._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_548._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::Address((Address *)local_350);
  cfd::core::Pubkey::Pubkey(&local_520);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"");
    cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
              ((ElementsConfidentialAddress *)local_508,&local_548);
    cfd::core::ElementsConfidentialAddress::operator=
              (&local_1d0,(ElementsConfidentialAddress *)local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_p != &local_360) {
      operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
    }
    if (local_388 != (pointer)0x0) {
      operator_delete(local_388,(long)local_378 - (long)local_388);
    }
    cfd::core::Address::~Address((Address *)local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != &local_548.field_2) {
      operator_delete(local_548._M_dataplus._M_p,
                      (ulong)(local_548.field_2._M_allocated_capacity + 1));
    }
  }
  testing::Message::Message((Message *)local_508);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_548,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
             ,0x2a,
             "Expected: (empty_address = ElementsConfidentialAddress(\"\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_548,(Message *)local_508);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_548);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_508._0_8_ + 8))();
    }
    local_508._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
              ((ElementsConfidentialAddress *)local_508,(Address *)local_350,&local_520);
    cfd::core::ElementsConfidentialAddress::operator=
              (&local_1d0,(ElementsConfidentialAddress *)local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_p != &local_360) {
      operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
    }
    if (local_388 != (pointer)0x0) {
      operator_delete(local_388,(long)local_378 - (long)local_388);
    }
    cfd::core::Address::~Address((Address *)local_508);
  }
  testing::Message::Message((Message *)local_508);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_548,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
             ,0x2c,
             "Expected: (empty_address = ElementsConfidentialAddress(unblind_addr, key)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_548,(Message *)local_508);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_548);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_508._0_8_ + 8))();
    }
    local_508._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
  }
  pvVar1 = (void *)CONCAT71(local_520.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_520.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_520.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  cfd::core::Address::~Address((Address *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.address_._M_dataplus._M_p != &local_1d0.address_.field_2) {
    operator_delete(local_1d0.address_._M_dataplus._M_p,
                    local_1d0.address_.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0.confidential_key_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.confidential_key_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Address::~Address(&local_1d0.unblinded_address_);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, EmptyAddressTest) {
  ElementsConfidentialAddress empty_address;
  EXPECT_STREQ("",
               empty_address.GetUnblindedAddress().GetHash().GetHex().c_str());
  EXPECT_STREQ("", empty_address.GetConfidentialKey().GetHex().c_str());

  Address unblind_addr;
  ConfidentialKey key;
  EXPECT_THROW((empty_address = ElementsConfidentialAddress("")), CfdException);
  EXPECT_THROW((empty_address = ElementsConfidentialAddress(unblind_addr, key)),
               CfdException);
}